

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

JavascriptArray * __thiscall Js::RecyclableArrayWalker::GetArrayObject(RecyclableArrayWalker *this)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *pJVar4;
  
  bVar2 = JavascriptArray::IsNonES5Array((this->super_RecyclableObjectWalker).instance);
  if (!bVar2) {
    bVar2 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xbae,
                                  "(Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance))"
                                  ,
                                  "Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  bVar2 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance);
  aValue = (this->super_RecyclableObjectWalker).instance;
  if (bVar2) {
    pJVar4 = (JavascriptArray *)VarTo<Js::RecyclableObject>(aValue);
    return pJVar4;
  }
  pJVar4 = VarTo<Js::JavascriptArray>(aValue);
  return pJVar4;
}

Assistant:

Js::JavascriptArray* RecyclableArrayWalker::GetArrayObject()
    {
        Assert(Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance));
        return  Js::VarIs<Js::ES5Array>(instance) ?
                    static_cast<Js::JavascriptArray *>(VarTo<RecyclableObject>(instance)) :
                    Js::VarTo<Js::JavascriptArray>(instance);
    }